

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_Test::
TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_Test
          (TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_Test *this)

{
  TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockCallTest::TEST_GROUP_CppUTestGroupMockCallTest
            (&this->super_TEST_GROUP_CppUTestGroupMockCallTest);
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_Test_003543d0;
  return;
}

Assistant:

TEST(MockCallTest, expectOneCallInOneScopeButActualCallInAnotherScope)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest emptyExpectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "class::foo", emptyExpectations);

    mock("scope").expectOneCall("foo");
    mock("class").actualCall("foo");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
    mock().clear();
}